

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_data.hpp
# Opt level: O2

LogicalOperatorType __thiscall
duckdb::SerializationData::Get<duckdb::LogicalOperatorType>(SerializationData *this)

{
  _Elt_pointer puVar1;
  
  AssertNotEmpty<unsigned_long>(this,&this->enums);
  puVar1 = (this->enums).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (this->enums).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar1 = (this->enums).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  return *(LogicalOperatorType *)(puVar1 + -1);
}

Assistant:

inline LogicalOperatorType SerializationData::Get() {
	AssertNotEmpty(enums);
	return LogicalOperatorType(enums.top());
}